

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
duckdb_re2::Prog::EmitList
          (Prog *this,int root,SparseArray<int> *rootmap,
          vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_> *flat,
          SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  pointer *ppIVar1;
  pointer piVar2;
  iterator iVar3;
  int *piVar4;
  Inst *pIVar5;
  IndexValue *pIVar6;
  iterator iVar7;
  pointer pIVar8;
  bool bVar9;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false> i;
  uint uVar10;
  int iVar11;
  Deleter local_4c;
  vector<int,_std::allocator<int>_> *local_48;
  anon_union_4_5_a14c903b_for_Inst_2 local_3c;
  Prog *local_38;
  
  reachable->size_ = 0;
  piVar2 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2;
  }
  iVar3._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_4c.len_ = root;
  local_48 = stk;
  local_38 = this;
  if (iVar3._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar3,&local_4c.len_);
  }
  else {
    *iVar3._M_current = root;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar3._M_current + 1;
  }
  do {
    piVar2 = (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar2) {
      return;
    }
    i._M_head_impl.len_ = (Deleter)piVar2[-1];
    (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2 + -1;
    do {
      piVar4 = (reachable->dense_).ptr_._M_t.
               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if ((((piVar4 != (int *)0x0) &&
           ((uint)i._M_head_impl.len_ <
            (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                           super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                           super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)) &&
          (uVar10 = (reachable->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_],
          uVar10 < (uint)reachable->size_)) && ((Deleter)piVar4[(int)uVar10] == i._M_head_impl.len_)
         ) break;
      SparseSetT<void>::InsertInternal(reachable,false,(int)i._M_head_impl.len_);
      if (((i._M_head_impl.len_ != (Deleter)local_4c.len_) &&
          (pIVar6 = (rootmap->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                    .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                    _M_head_impl, pIVar6 != (IndexValue *)0x0)) &&
         (((uint)i._M_head_impl.len_ <
           (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                          super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          .
                          super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                          .
                          super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
          && ((uVar10 = (rootmap->sparse_).ptr_._M_t.
                        super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_],
              uVar10 < (uint)rootmap->size_ &&
              ((Deleter)pIVar6[(int)uVar10].index_ == i._M_head_impl.len_)))))) {
        iVar7._M_current =
             (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (flat->
            super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
          _M_realloc_insert<>(flat,iVar7);
        }
        else {
          (iVar7._M_current)->out_opcode_ = 0;
          (iVar7._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
          ppIVar1 = &(flat->
                     super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        pIVar8 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar10 = pIVar8[-1].out_opcode_;
        pIVar8[-1].out_opcode_ = uVar10 & 0xfffffff8 | 6;
        pIVar8[-1].out_opcode_ =
             uVar10 & 8 | 6 |
             (rootmap->dense_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
             [(rootmap->sparse_).ptr_._M_t.
              super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
              super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_]].value_ <<
             4;
        break;
      }
      pIVar5 = (local_38->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      switch(pIVar5[(int)i._M_head_impl.len_].out_opcode_ & 7) {
      case 1:
        iVar7._M_current =
             (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (flat->
            super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
          _M_realloc_insert<>(flat,iVar7);
        }
        else {
          (iVar7._M_current)->out_opcode_ = 0;
          (iVar7._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
          ppIVar1 = &(flat->
                     super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        pIVar8 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        uVar10 = (pIVar8[-1].out_opcode_ & 0xfffffff8) + 1;
        pIVar8[-1].out_opcode_ = uVar10;
        iVar11 = (int)((ulong)((long)pIVar8 -
                              (long)(flat->
                                    super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar8[-1].out_opcode_ = uVar10 & 9 | iVar11 << 4;
        pIVar8[-1].field_1.out1_ = iVar11 + 1;
      case 0:
        local_3c = pIVar5[(int)i._M_head_impl.len_].field_1;
        iVar3._M_current =
             (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_48,iVar3,&local_3c.cap_);
        }
        else {
          *iVar3._M_current = (int)local_3c;
          (local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
        i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
        bVar9 = true;
        break;
      default:
        iVar7._M_current =
             (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (flat->
            super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
          _M_realloc_insert<>(flat,iVar7);
        }
        else {
          (iVar7._M_current)->out_opcode_ = 0;
          (iVar7._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
          ppIVar1 = &(flat->
                     super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5[(int)i._M_head_impl.len_];
        pIVar8 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pIVar8[-1].out_opcode_ =
             pIVar8[-1].out_opcode_ & 0xf |
             (rootmap->dense_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
             [(rootmap->sparse_).ptr_._M_t.
              super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
              super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl
              [pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4]].value_ << 4;
        goto LAB_00498a3c;
      case 5:
      case 7:
        iVar7._M_current =
             (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (flat->
            super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
          _M_realloc_insert<>(flat,iVar7);
        }
        else {
          (iVar7._M_current)->out_opcode_ = 0;
          (iVar7._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
          ppIVar1 = &(flat->
                     super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5[(int)i._M_head_impl.len_];
LAB_00498a3c:
        bVar9 = false;
        break;
      case 6:
        i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
        bVar9 = true;
      }
    } while (bVar9);
  } while( true );
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}